

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::NameSyntax> *args_2;
  SyntaxNode *args_5;
  PathDescriptionSyntax *pPVar1;
  Token local_80;
  Token local_70;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::NameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)(__fn + 0x38),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x90),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PathDescriptionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::PathSuffixSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_70,&local_80,args_2,&local_40,&local_50,
                      (PathSuffixSyntax *)args_5,(Token *)&visitor);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PathDescriptionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PathDescriptionSyntax>(
        node.openParen.deepClone(alloc),
        node.edgeIdentifier.deepClone(alloc),
        *deepClone(node.inputs, alloc),
        node.polarityOperator.deepClone(alloc),
        node.pathOperator.deepClone(alloc),
        *deepClone<PathSuffixSyntax>(*node.suffix, alloc),
        node.closeParen.deepClone(alloc)
    );
}